

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O3

bool __thiscall
cmInstallFileSetGenerator::Compute(cmInstallFileSetGenerator *this,cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  
  this->LocalGenerator = lg;
  pcVar1 = cmLocalGenerator::FindLocalNonAliasGeneratorTarget(lg,&this->TargetName);
  this->Target = pcVar1;
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    pcVar1 = cmGlobalGenerator::FindGeneratorTarget(lg->GlobalGenerator,&this->TargetName);
    this->Target = pcVar1;
  }
  return true;
}

Assistant:

bool cmInstallFileSetGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  // Lookup this target in the current directory.
  this->Target = lg->FindLocalNonAliasGeneratorTarget(this->TargetName);
  if (!this->Target) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }

  return true;
}